

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * Strsafe_find(char *key)

{
  uint uVar1;
  int iVar2;
  char *local_30;
  s_x1node *local_28;
  x1node *np;
  uint h;
  char *key_local;
  
  if (x1a == (s_x1 *)0x0) {
    key_local = (char *)0x0;
  }
  else {
    uVar1 = strhash(key);
    local_28 = x1a->ht[uVar1 & x1a->size - 1U];
    while ((local_28 != (s_x1node *)0x0 && (iVar2 = strcmp(local_28->data,key), iVar2 != 0))) {
      local_28 = local_28->next;
    }
    if (local_28 == (s_x1node *)0x0) {
      local_30 = (char *)0x0;
    }
    else {
      local_30 = local_28->data;
    }
    key_local = local_30;
  }
  return key_local;
}

Assistant:

const char *Strsafe_find(const char *key)
{
  unsigned h;
  x1node *np;

  if( x1a==0 ) return 0;
  h = strhash(key) & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}